

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

double cross_entropy<unsigned_int,unsigned_int>
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *P,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *Q)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined1 auVar5 [16];
  undefined8 uVar7;
  undefined1 auVar6 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double q;
  double p;
  size_t i;
  double m;
  double n;
  double H0;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff90;
  undefined8 local_50;
  undefined8 local_18;
  
  uVar7 = 0;
  local_18 = 0.0;
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff88._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff88._M_current);
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff88._M_current);
  std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_ffffffffffffff88._M_current);
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
  auVar6 = ZEXT1664(CONCAT88(uVar7,(double)iVar2));
  local_50 = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
    if (sVar3 <= local_50) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_50);
    if (*pvVar4 != 0) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,local_50)
      ;
      auVar8 = auVar6._0_16_;
      if (*pvVar4 != 0) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RDI,local_50);
        auVar8 = vcvtusi2sd_avx512f(auVar8,*pvVar4);
        auVar5._0_8_ = auVar8._0_8_ / (double)iVar1;
        auVar5._8_8_ = auVar8._8_8_;
        auVar8 = auVar5;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (in_RSI,local_50);
        auVar8 = vcvtusi2sd_avx512f(auVar8,*pvVar4);
        auVar6._0_8_ = log2(auVar8._0_8_ / (double)iVar2);
        auVar6._8_56_ = extraout_var;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar5._0_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_18;
        auVar8 = vfmadd213sd_fma(auVar6._0_16_,auVar8,auVar9);
        auVar6 = ZEXT1664(auVar8);
        local_18 = auVar8._0_8_;
      }
    }
    local_50 = local_50 + 1;
  }
  return -local_18;
}

Assistant:

double cross_entropy(const std::vector<X>& P, const std::vector<Y>& Q)
{
    double H0 = 0.0;
    double n = std::accumulate(std::begin(P), std::end(P), 0);
    double m = std::accumulate(std::begin(Q), std::end(Q), 0);
    for (size_t i = 0; i < P.size(); i++) {
        if (P[i] != 0 && Q[i] != 0) {
            double p = double(P[i]) / n;
            double q = double(Q[i]) / m;
            H0 += (p * log2(q));
        }
    }
    return -H0;
}